

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::DeepScanLineOutputFile::writePixels(DeepScanLineOutputFile *this,int numScanLines)

{
  int *piVar1;
  pthread_mutex_t *__mutex;
  Data *pDVar2;
  pointer ppLVar3;
  LineBuffer *pLVar4;
  pointer ppLVar5;
  int iVar6;
  LineBufferTask *pLVar7;
  ulong uVar8;
  ArgExc *pAVar9;
  IoExc *this_00;
  int iVar10;
  size_t i;
  long lVar11;
  string *psVar12;
  int iVar13;
  string *psVar14;
  int scanLineMin;
  int number;
  bool bVar15;
  int local_1e8;
  int local_1e4;
  int local_1d4;
  int local_1c0;
  TaskGroup taskGroup;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  std::mutex::lock((mutex *)&__mutex->__data);
  pDVar2 = this->_data;
  if ((pDVar2->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar2->slices).
      super__Vector_base<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::OutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar9,"No frame buffer specified as pixel data source.");
    __cxa_throw(pAVar9,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  iVar6 = (pDVar2->currentScanLine - pDVar2->minY) / pDVar2->linesInBuffer;
  IlmThread_3_4::TaskGroup::TaskGroup(&taskGroup);
  pDVar2 = this->_data;
  local_1c0 = pDVar2->currentScanLine;
  if (pDVar2->lineOrder == INCREASING_Y) {
    local_1d4 = numScanLines + local_1c0 + -1;
    local_1e4 = (local_1d4 - pDVar2->minY) / pDVar2->linesInBuffer;
    local_1e8 = (local_1e4 - iVar6) + 1;
    iVar10 = (int)((ulong)((long)(pDVar2->lineBuffers).
                                 super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pDVar2->lineBuffers).
                                super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar10 <= local_1e8) {
      local_1e8 = iVar10;
    }
    if (local_1e8 < 2) {
      local_1e8 = 1;
    }
    iVar10 = iVar6;
    iVar13 = local_1e8;
    while (bVar15 = iVar13 != 0, iVar13 = iVar13 + -1, bVar15) {
      pLVar7 = (LineBufferTask *)operator_new(0x20);
      anon_unknown_7::LineBufferTask::LineBufferTask
                (pLVar7,&taskGroup,this->_data,iVar10,local_1c0,local_1d4);
      IlmThread_3_4::ThreadPool::addGlobalTask((Task *)pLVar7);
      iVar10 = iVar10 + 1;
    }
    local_1e4 = local_1e4 + 1;
    iVar10 = 1;
  }
  else {
    local_1e4 = ((local_1c0 - (pDVar2->minY + numScanLines)) + 1) / pDVar2->linesInBuffer;
    scanLineMin = (local_1c0 - numScanLines) + 1;
    iVar10 = (iVar6 - local_1e4) + 1;
    iVar13 = (int)((ulong)((long)(pDVar2->lineBuffers).
                                 super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pDVar2->lineBuffers).
                                super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar13 <= iVar10) {
      iVar10 = iVar13;
    }
    number = iVar6;
    iVar13 = 1;
    local_1e8 = 1;
    if (1 < iVar10) {
      iVar13 = iVar10;
      local_1e8 = iVar10;
    }
    while (iVar13 != 0) {
      pLVar7 = (LineBufferTask *)operator_new(0x20);
      anon_unknown_7::LineBufferTask::LineBufferTask
                (pLVar7,&taskGroup,this->_data,number,scanLineMin,local_1c0);
      IlmThread_3_4::ThreadPool::addGlobalTask((Task *)pLVar7);
      number = number + -1;
      iVar13 = iVar13 + -1;
    }
    local_1e8 = -local_1e8;
    local_1e4 = local_1e4 + -1;
    iVar10 = -1;
    local_1d4 = local_1c0;
    local_1c0 = scanLineMin;
  }
  local_1e8 = iVar6 + local_1e8;
  uVar8 = (ulong)iVar6;
  while( true ) {
    iVar6 = iVar6 + iVar10;
    pDVar2 = this->_data;
    if (pDVar2->missingScanLines < 1) {
      pAVar9 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc
                (pAVar9,"Tried to write more scan lines than specified by the data window.");
      __cxa_throw(pAVar9,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    ppLVar3 = (pDVar2->lineBuffers).
              super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar4 = ppLVar3[uVar8 % (ulong)((long)(pDVar2->lineBuffers).
                                           super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)ppLVar3 >> 3)];
    IlmThread_3_4::Semaphore::wait();
    iVar13 = (pLVar4->scanLineMax - pLVar4->scanLineMin) + 1;
    pDVar2 = this->_data;
    pDVar2->missingScanLines = pDVar2->missingScanLines - iVar13;
    bVar15 = pLVar4->partiallyFull;
    if (bVar15 == true) break;
    anon_unknown_7::writePixelData
              (pDVar2->_streamData,pDVar2,pLVar4->minY,pLVar4->dataPtr,pLVar4->dataSize,
               pLVar4->uncompressedDataSize,pLVar4->sampleCountTablePtr,pLVar4->sampleCountTableSize
              );
    piVar1 = &this->_data->currentScanLine;
    *piVar1 = *piVar1 + iVar13 * iVar10;
    IlmThread_3_4::Semaphore::post();
    if (local_1e4 == iVar6) goto LAB_0016d58d;
    iVar13 = local_1e4;
    if (local_1e8 != local_1e4) {
      pLVar7 = (LineBufferTask *)operator_new(0x20);
      anon_unknown_7::LineBufferTask::LineBufferTask
                (pLVar7,&taskGroup,this->_data,local_1e8,local_1c0,local_1d4);
      IlmThread_3_4::ThreadPool::addGlobalTask((Task *)pLVar7);
      iVar13 = local_1e8 + iVar10;
    }
    uVar8 = uVar8 + (long)iVar10;
    local_1e8 = iVar13;
  }
  pDVar2->currentScanLine = pDVar2->currentScanLine + iVar13 * iVar10;
  IlmThread_3_4::Semaphore::post();
LAB_0016d58d:
  IlmThread_3_4::TaskGroup::~TaskGroup(&taskGroup);
  if (bVar15 == false) {
    ppLVar3 = (this->_data->lineBuffers).
              super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppLVar5 = (this->_data->lineBuffers).
              super__Vector_base<Imf_3_4::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    psVar12 = (string *)0x0;
    for (lVar11 = 0; (long)ppLVar5 - (long)ppLVar3 >> 3 != lVar11; lVar11 = lVar11 + 1) {
      pLVar4 = ppLVar3[lVar11];
      psVar14 = (string *)&pLVar4->exception;
      if (psVar12 != (string *)0x0) {
        psVar14 = psVar12;
      }
      if (pLVar4->hasException != false) {
        psVar12 = psVar14;
      }
      pLVar4->hasException = false;
    }
    if (psVar12 != (string *)0x0) {
      this_00 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(this_00,psVar12);
      __cxa_throw(this_00,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepScanLineOutputFile::writePixels (int numScanLines)
{
    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
        if (_data->slices.size () == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                                         "as pixel data source.");

        //
        // Maintain two iterators:
        //     nextWriteBuffer: next linebuffer to be written to the file
        //     nextCompressBuffer: next linebuffer to compress
        //

        int first =
            (_data->currentScanLine - _data->minY) / _data->linesInBuffer;

        int nextWriteBuffer = first;
        int nextCompressBuffer;
        int stop;
        int step;
        int scanLineMin;
        int scanLineMax;

        {
            //
            // Create a task group for all line buffer tasks. When the
            // taskgroup goes out of scope, the destructor waits until
            // all tasks are complete.
            //

            TaskGroup taskGroup;

            //
            // Determine the range of lineBuffers that intersect the scan
            // line range.  Then add the initial compression tasks to the
            // thread pool.  We always add in at least one task but the
            // individual task might not do anything if numScanLines == 0.
            //

            if (_data->lineOrder == INCREASING_Y)
            {
                int last = (_data->currentScanLine + (numScanLines - 1) -
                            _data->minY) /
                           _data->linesInBuffer;

                scanLineMin = _data->currentScanLine;
                scanLineMax = _data->currentScanLine + numScanLines - 1;

                int numTasks = max (
                    min ((int) _data->lineBuffers.size (), last - first + 1),
                    1);

                for (int i = 0; i < numTasks; i++)
                {
                    ThreadPool::addGlobalTask (new LineBufferTask (
                        &taskGroup,
                        _data,
                        first + i,
                        scanLineMin,
                        scanLineMax));
                }

                nextCompressBuffer = first + numTasks;
                stop               = last + 1;
                step               = 1;
            }
            else
            {
                int last = (_data->currentScanLine - (numScanLines - 1) -
                            _data->minY) /
                           _data->linesInBuffer;

                scanLineMax = _data->currentScanLine;
                scanLineMin = _data->currentScanLine - numScanLines + 1;

                int numTasks = max (
                    min ((int) _data->lineBuffers.size (), first - last + 1),
                    1);

                for (int i = 0; i < numTasks; i++)
                {
                    ThreadPool::addGlobalTask (new LineBufferTask (
                        &taskGroup,
                        _data,
                        first - i,
                        scanLineMin,
                        scanLineMax));
                }

                nextCompressBuffer = first - numTasks;
                stop               = last - 1;
                step               = -1;
            }

            while (true)
            {
                if (_data->missingScanLines <= 0)
                {
                    throw IEX_NAMESPACE::ArgExc (
                        "Tried to write more scan lines "
                        "than specified by the data window.");
                }

                //
                // Wait until the next line buffer is ready to be written
                //

                LineBuffer* writeBuffer =
                    _data->getLineBuffer (nextWriteBuffer);

                writeBuffer->wait ();

                int numLines =
                    writeBuffer->scanLineMax - writeBuffer->scanLineMin + 1;

                _data->missingScanLines -= numLines;

                //
                // If the line buffer is only partially full, then it is
                // not complete and we cannot write it to disk yet.
                //

                if (writeBuffer->partiallyFull)
                {
                    _data->currentScanLine =
                        _data->currentScanLine + step * numLines;
                    writeBuffer->post ();

                    return;
                }

                //
                // Write the line buffer
                //

                writePixelData (_data->_streamData, _data, writeBuffer);
                nextWriteBuffer += step;

                _data->currentScanLine =
                    _data->currentScanLine + step * numLines;

#ifdef DEBUG

                assert (
                    _data->currentScanLine ==
                    ((_data->lineOrder == INCREASING_Y)
                         ? writeBuffer->scanLineMax + 1
                         : writeBuffer->scanLineMin - 1));

#endif

                //
                // Release the lock on the line buffer
                //

                writeBuffer->post ();

                //
                // If this was the last line buffer in the scanline range
                //

                if (nextWriteBuffer == stop) break;

                //
                // If there are no more line buffers to compress,
                // then only continue to write out remaining lineBuffers
                //

                if (nextCompressBuffer == stop) continue;

                //
                // Add nextCompressBuffer as a compression task
                //

                ThreadPool::addGlobalTask (new LineBufferTask (
                    &taskGroup,
                    _data,
                    nextCompressBuffer,
                    scanLineMin,
                    scanLineMax));

                //
                // Update the next line buffer we need to compress
                //

                nextCompressBuffer += step;
            }

            //
            // Finish all tasks
            //
        }

        //
        // Exception handling:
        //
        // LineBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to OutputFile::writePixels().
        // LineBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the line buffers.
        // Now we check if any line buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple line buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string* exception = 0;

        for (size_t i = 0; i < _data->lineBuffers.size (); ++i)
        {
            LineBuffer* lineBuffer = _data->lineBuffers[i];

            if (lineBuffer->hasException && !exception)
                exception = &lineBuffer->exception;

            lineBuffer->hasException = false;
        }

        if (exception) throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Failed to write pixel data to image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}